

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  ushort uVar1;
  int iVar2;
  int *piVar3;
  StkId pTVar4;
  GCObject *pGVar5;
  StkId pTVar6;
  long lVar7;
  
  if (from != to) {
    piVar3 = *(int **)&to[-1].hookmask;
    iVar2 = *piVar3;
    *piVar3 = iVar2 + 1;
    if (iVar2 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(to) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x7e,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    lVar7 = (long)n;
    if ((long)from->top - (long)from->ci->func >> 4 <= lVar7) {
      __assert_fail("((n) < (from->top - from->ci->func)) && \"not enough elements in the stack\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x7f,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    if (from->l_G != to->l_G) {
      __assert_fail("((from->l_G) == (to->l_G)) && \"moving among independent states\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x80,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    if ((long)to->ci->top - (long)to->top >> 4 < lVar7) {
      __assert_fail("(to->ci->top - to->top >= n) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x81,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    from->top = from->top + -lVar7;
    if (n < 1) {
      *piVar3 = 0;
    }
    else {
      pTVar6 = to->top;
      lVar7 = 0;
      do {
        pTVar4 = from->top;
        pGVar5 = *(GCObject **)((long)&pTVar4->value_ + lVar7);
        (pTVar6->value_).gc = pGVar5;
        uVar1 = *(ushort *)((long)&pTVar4->tt_ + lVar7);
        pTVar6->tt_ = uVar1;
        if (((short)uVar1 < 0) &&
           (((uVar1 & 0x7f) != (ushort)pGVar5->tt ||
            ((pGVar5->marked & (to->l_G->currentwhite ^ 0x18)) != 0)))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x84,"void lua_xmove(lua_State *, lua_State *, int)");
        }
        lVar7 = lVar7 + 0x10;
        pTVar6 = to->top + 1;
        to->top = pTVar6;
      } while ((ulong)(uint)n << 4 != lVar7);
      piVar3 = *(int **)&to[-1].hookmask;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 != 0) {
        __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(to) - sizeof(struct L_EXTRA)))))->plock) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x87,"void lua_xmove(lua_State *, lua_State *, int)");
      }
    }
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to), "moving among independent states");
  api_check(from, to->ci->top - to->top >= n, "stack overflow");
  from->top -= n;
  for (i = 0; i < n; i++) {
    setobj2s(to, to->top, from->top + i);
    to->top++;  /* stack already checked by previous 'api_check' */
  }
  lua_unlock(to);
}